

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

void Jf_ManDeriveMapping(Jf_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *pCut_00;
  bool bVar3;
  int *pCut;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vMapping;
  Jf_Man_t *p_local;
  
  if (p->pPars->fCutMin != 0) {
    __assert_fail("!p->pPars->fCutMin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                  ,0x60b,"void Jf_ManDeriveMapping(Jf_Man_t *)");
  }
  iVar1 = Gia_ManObjNum(p->pGia);
  p_00 = Vec_IntAlloc(iVar1 + (int)p->pPars->Edge + (int)p->pPars->Area * 2);
  iVar1 = Gia_ManObjNum(p->pGia);
  Vec_IntFill(p_00,iVar1,0);
  pCut._4_4_ = 0;
  while( true ) {
    bVar3 = false;
    if (pCut._4_4_ < p->pGia->nObjs) {
      _k = Gia_ManObj(p->pGia,pCut._4_4_);
      bVar3 = _k != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjIsAnd(_k);
    if (((iVar1 != 0) && (iVar1 = Gia_ObjIsBuf(_k), iVar1 == 0)) &&
       (iVar1 = Gia_ObjRefNum(p->pGia,_k), iVar1 != 0)) {
      pCut_00 = Jf_ObjCutBest(p,pCut._4_4_);
      iVar1 = Vec_IntSize(p_00);
      Vec_IntWriteEntry(p_00,pCut._4_4_,iVar1);
      if ((p->pPars->fCutMin != 0) && (iVar1 = Jf_CutSize(pCut_00), 6 < iVar1)) {
        __assert_fail("!p->pPars->fCutMin || Jf_CutSize(pCut) <= 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                      ,0x614,"void Jf_ManDeriveMapping(Jf_Man_t *)");
      }
      iVar1 = Jf_CutSize(pCut_00);
      Vec_IntPush(p_00,iVar1);
      for (pCut._0_4_ = 1; iVar1 = Jf_CutSize(pCut_00), (int)pCut <= iVar1;
          pCut._0_4_ = (int)pCut + 1) {
        iVar1 = Jf_CutVar(pCut_00,(int)pCut);
        Vec_IntPush(p_00,iVar1);
      }
      Vec_IntPush(p_00,pCut._4_4_);
    }
    pCut._4_4_ = pCut._4_4_ + 1;
  }
  iVar1 = Vec_IntCap(p_00);
  if (iVar1 != 0x10) {
    iVar1 = Vec_IntSize(p_00);
    iVar2 = Vec_IntCap(p_00);
    if (iVar1 != iVar2) {
      __assert_fail("Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                    ,0x61a,"void Jf_ManDeriveMapping(Jf_Man_t *)");
    }
  }
  p->pGia->vMapping = p_00;
  return;
}

Assistant:

void Jf_ManDeriveMapping( Jf_Man_t * p )
{
    Vec_Int_t * vMapping;
    Gia_Obj_t * pObj; 
    int i, k, * pCut;
    assert( !p->pPars->fCutMin );
    vMapping = Vec_IntAlloc( Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + (int)p->pPars->Area * 2 );
    Vec_IntFill( vMapping, Gia_ManObjNum(p->pGia), 0 );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) || Gia_ObjRefNum(p->pGia, pObj) == 0 )
            continue;
        pCut = Jf_ObjCutBest( p, i );
        Vec_IntWriteEntry( vMapping, i, Vec_IntSize(vMapping) );
        assert( !p->pPars->fCutMin || Jf_CutSize(pCut) <= 6 );
        Vec_IntPush( vMapping, Jf_CutSize(pCut) );
        for ( k = 1; k <= Jf_CutSize(pCut); k++ )
            Vec_IntPush( vMapping, Jf_CutVar(pCut, k) );
        Vec_IntPush( vMapping, i );
    }
    assert( Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping) );
    p->pGia->vMapping = vMapping;
//    Gia_ManMappingVerify( p->pGia );
}